

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader_test.cc
# Opt level: O2

Reader * xLearn::CreateReader(char *format_name)

{
  ObjectCreatorRegistry_xLearn_reader_registry *this;
  Reader *pRVar1;
  allocator local_39;
  string local_38;
  
  this = GetRegistry_xLearn_reader_registry();
  std::__cxx11::string::string((string *)&local_38,format_name,&local_39);
  pRVar1 = ObjectCreatorRegistry_xLearn_reader_registry::CreateObject(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return pRVar1;
}

Assistant:

Reader* CreateReader(const char* format_name) {
  return CREATE_READER(format_name);
}